

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ExprNodeTest_STRING(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5ExprTerm **ppFVar1;
  u8 uVar2;
  u32 nData;
  Fts5ExprNearset *pFVar3;
  Fts5ExprPhrase *pFVar4;
  Fts5IndexIter *pFVar5;
  u8 *puVar6;
  bool bVar7;
  u8 *puVar8;
  char cVar9;
  int iVar10;
  Fts5ExprTerm *p;
  Fts5ExprTerm *pFVar11;
  long lVar12;
  Fts5LookaheadReader *__s;
  int iVar13;
  Fts5ExprTerm *p_1;
  Fts5ExprTerm *pFVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  uint uVar18;
  Fts5ExprNearset *pFVar19;
  i64 *piVar20;
  ulong uVar21;
  Fts5ExprTerm *p_2;
  int *piVar22;
  long lVar23;
  long lVar24;
  char *pcVar25;
  long lVar26;
  undefined8 *puVar27;
  Fts5LookaheadReader *pFVar28;
  long in_FS_OFFSET;
  bool bVar29;
  int rc;
  u8 *a;
  int n;
  Fts5PoslistWriter writer;
  Fts5PoslistReader aStatic [4];
  undefined1 *local_178;
  ulong local_160;
  int local_12c;
  Fts5Buffer local_128;
  u8 *local_110;
  int local_104;
  Fts5PoslistWriter local_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar3 = pNode->pNear;
  pFVar4 = pFVar3->apPhrase[0];
  uVar18 = pExpr->bDesc;
  if (pFVar4->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
    lVar24 = (pFVar4->aTerm[0].pIter)->iRowid;
  }
  else {
    pFVar11 = pFVar4->aTerm;
    lVar24 = 0;
    bVar17 = false;
    do {
      if ((pFVar11->pIter->bEof == '\0') &&
         ((lVar15 = pFVar11->pIter->iRowid, !bVar17 || (bVar17 = true, uVar18 != lVar15 < lVar24))))
      {
        bVar17 = true;
        lVar24 = lVar15;
      }
      pFVar11 = pFVar11->pSynonym;
    } while (pFVar11 != (Fts5ExprTerm *)0x0);
  }
  iVar10 = 0;
  do {
    if (pFVar3->nPhrase < 1) {
      bVar17 = false;
    }
    else {
      bVar17 = true;
      lVar15 = 0;
      do {
        pFVar4 = pFVar3->apPhrase[lVar15];
        if (pFVar4->nTerm < 1) {
          bVar29 = true;
        }
        else {
          lVar26 = 0;
          iVar13 = iVar10;
          do {
            pFVar11 = pFVar4->aTerm + lVar26;
            iVar10 = iVar13;
            if (pFVar11->pSynonym == (Fts5ExprTerm *)0x0) {
              pFVar5 = pFVar11->pIter;
              lVar12 = pFVar5->iRowid;
              if (lVar12 == lVar24) {
                iVar13 = 9;
                bVar29 = false;
              }
              else {
                if ((uVar18 == 0 && lVar12 < lVar24) ||
                   (bVar17 = true, lVar23 = lVar12, uVar18 != 0 && lVar24 < lVar12)) {
                  iVar10 = sqlite3Fts5IterNextFrom(pFVar5,lVar24);
                  if ((iVar10 == 0) && (pFVar5->bEof == '\0')) {
                    lVar12 = pFVar5->iRowid;
                    bVar17 = true;
                  }
                  else {
                    pNode->bEof = 1;
                    bVar17 = false;
                    iVar13 = iVar10;
                  }
                  lVar23 = lVar24;
                  iVar10 = iVar13;
                  if (bVar17) {
                    lVar23 = lVar12;
                  }
                }
                lVar24 = lVar23;
                if (bVar17) {
                  bVar29 = true;
                  bVar17 = false;
                  iVar13 = 0;
                }
                else {
                  iVar13 = 1;
                  bVar17 = false;
                  bVar29 = false;
                  local_178._0_4_ = iVar10;
                }
              }
              if (bVar29) goto LAB_001e3614;
            }
            else {
              lVar12 = 0;
              bVar29 = false;
              pFVar14 = pFVar11;
              do {
                if ((pFVar14->pIter->bEof == '\0') &&
                   ((lVar23 = pFVar14->pIter->iRowid, !bVar29 ||
                    (bVar29 = true, uVar18 != lVar23 < lVar12)))) {
                  bVar29 = true;
                  lVar12 = lVar23;
                }
                pFVar14 = pFVar14->pSynonym;
              } while (pFVar14 != (Fts5ExprTerm *)0x0);
              pFVar14 = pFVar11;
              if (lVar12 == lVar24) {
                iVar13 = 9;
                bVar7 = false;
              }
              else {
                do {
                  pFVar5 = pFVar14->pIter;
                  iVar10 = 0;
                  if (pFVar5->bEof == '\0') {
                    if ((uVar18 == 0 && pFVar5->iRowid < lVar24) ||
                       (uVar18 != 0 && lVar24 < pFVar5->iRowid)) {
                      iVar10 = sqlite3Fts5IterNextFrom(pFVar5,lVar24);
                    }
                  }
                } while ((iVar10 == 0) &&
                        (ppFVar1 = &pFVar14->pSynonym, pFVar14 = *ppFVar1,
                        *ppFVar1 != (Fts5ExprTerm *)0x0));
                bVar17 = false;
                bVar29 = false;
                if (iVar10 == 0) {
                  lVar24 = 0;
                  bVar29 = false;
                  do {
                    if ((pFVar11->pIter->bEof == '\0') &&
                       ((lVar12 = pFVar11->pIter->iRowid, !bVar29 ||
                        (bVar29 = true, uVar18 != lVar12 < lVar24)))) {
                      bVar29 = true;
                      lVar24 = lVar12;
                    }
                    pFVar11 = pFVar11->pSynonym;
                    iVar10 = iVar13;
                  } while (pFVar11 != (Fts5ExprTerm *)0x0);
                }
                bVar7 = true;
                if (bVar29) {
                  iVar13 = 0;
                }
                else {
                  pNode->bEof = 1;
                  pNode->bNomatch = 0;
                  iVar13 = 1;
                  bVar17 = false;
                  bVar7 = false;
                  local_178._0_4_ = iVar10;
                }
              }
              if (bVar7) {
LAB_001e3614:
                iVar13 = 0;
              }
            }
            if ((iVar13 != 9) && (iVar13 != 0)) goto LAB_001e368f;
            lVar26 = lVar26 + 1;
            iVar13 = iVar10;
          } while (lVar26 < pFVar4->nTerm);
          iVar13 = 0;
LAB_001e368f:
          bVar29 = iVar13 == 0;
        }
        if (!bVar29) goto LAB_001e3735;
        lVar15 = lVar15 + 1;
      } while (lVar15 < pFVar3->nPhrase);
      bVar17 = !bVar17;
    }
  } while (bVar17);
  pNode->iRowid = lVar24;
  pFVar3 = pNode->pNear;
  local_12c = iVar10;
  if (pExpr->pConfig->eDetail == 0) {
    lVar24 = 0;
    if (iVar10 == 0) {
      lVar24 = 0;
      do {
        if (pFVar3->nPhrase <= lVar24) break;
        pFVar4 = pFVar3->apPhrase[lVar24];
        if ((((1 < pFVar4->nTerm) || (pFVar4->aTerm[0].pSynonym != (Fts5ExprTerm *)0x0)) ||
            (pFVar3->pColset != (Fts5Colset *)0x0)) || (pFVar4->aTerm[0].bFirst != '\0')) {
          local_100.iPrev = 0;
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
          local_a8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
          local_b8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
          local_c8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
          local_d8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
          local_e8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
          local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          uVar2 = pFVar4->aTerm[0].bFirst;
          (pFVar4->poslist).n = 0;
          iVar10 = pFVar4->nTerm;
          local_178 = local_f8;
          if ((long)iVar10 < 5) {
LAB_001e384e:
            iVar10 = 0;
            memset(local_178,0,(long)pFVar4->nTerm << 5);
            if (0 < pFVar4->nTerm) {
              pFVar11 = pFVar4->aTerm;
              piVar22 = (int *)(local_178 + 0xc);
              lVar15 = 0;
              iVar10 = 0;
              do {
                local_104 = 0;
                local_110 = (u8 *)0x0;
                if (pFVar11->pSynonym == (Fts5ExprTerm *)0x0) {
                  local_110 = pFVar11->pIter->pData;
                  local_104 = pFVar11->pIter->nData;
                  bVar17 = false;
LAB_001e3924:
                  piVar22[-3] = 0;
                  piVar22[-2] = 0;
                  piVar22[-1] = 0;
                  piVar22[0] = 0;
                  piVar22[1] = 0;
                  piVar22[2] = 0;
                  piVar22[3] = 0;
                  piVar22[4] = 0;
                  *(u8 **)(piVar22 + -3) = local_110;
                  piVar22[-1] = local_104;
                  iVar13 = sqlite3Fts5PoslistNext64
                                     (local_110,local_104,piVar22,(i64 *)(piVar22 + 3));
                  if (iVar13 != 0) {
                    *(undefined1 *)((long)piVar22 + 5) = 1;
                  }
                  *(bool *)(piVar22 + 1) = bVar17;
                  cVar9 = (*(char *)((long)piVar22 + 5) != '\0') * '\x05';
                }
                else {
                  local_128.p = (u8 *)0x0;
                  local_128.n = 0;
                  local_128.nSpace = 0;
                  iVar10 = fts5ExprSynonymList(pFVar11,pNode->iRowid,&local_128,&local_110,
                                               &local_104);
                  puVar8 = local_110;
                  puVar6 = local_128.p;
                  if (iVar10 == 0) {
                    cVar9 = '\0';
                  }
                  else {
                    sqlite3_free(local_110);
                    cVar9 = '\x05';
                  }
                  bVar17 = iVar10 == 0 && puVar8 == puVar6;
                  if (iVar10 == 0) goto LAB_001e3924;
                }
                if (cVar9 != '\0') {
                  if (cVar9 == '\x05') goto LAB_001e3b3f;
                  goto LAB_001e3be0;
                }
                lVar15 = lVar15 + 1;
                piVar22 = piVar22 + 8;
                pFVar11 = pFVar11 + 1;
              } while (lVar15 < pFVar4->nTerm);
            }
            do {
              local_160 = *(ulong *)(local_178 + 0x18);
              do {
                if (pFVar4->nTerm < 1) {
                  bVar17 = false;
                }
                else {
                  bVar17 = true;
                  lVar15 = 0;
                  do {
                    lVar26 = local_160 + lVar15;
                    iVar13 = 0;
                    bVar29 = true;
                    if (*(long *)(local_178 + (lVar15 * 4 + 3) * 8) != lVar26) {
                      puVar27 = (undefined8 *)(local_178 + lVar15 * 0x20);
                      do {
                        lVar12 = *(long *)(local_178 + (lVar15 * 4 + 3) * 8);
                        if (lVar26 <= lVar12) {
                          if (lVar26 < lVar12) {
                            local_160 = lVar12 - lVar15;
                          }
                          iVar13 = 0;
                          goto LAB_001e3a4f;
                        }
                        iVar13 = sqlite3Fts5PoslistNext64
                                           ((u8 *)*puVar27,*(int *)(puVar27 + 1),
                                            (int *)((long)puVar27 + 0xc),
                                            (i64 *)(local_178 + (lVar15 * 4 + 3) * 8));
                        if (iVar13 != 0) {
                          *(undefined1 *)((long)puVar27 + 0x11) = 1;
                        }
                      } while (*(char *)((long)puVar27 + 0x11) == '\0');
                      bVar29 = false;
                      iVar13 = 5;
LAB_001e3a4f:
                      bVar17 = false;
                    }
                    if (!bVar29) goto LAB_001e3b1c;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 < pFVar4->nTerm);
                  bVar17 = !bVar17;
                }
              } while (bVar17);
              if ((uVar2 == '\0') || ((local_160 & 0x7fffffff) == 0)) {
                iVar10 = sqlite3Fts5PoslistWriterAppend(&pFVar4->poslist,&local_100,local_160);
                if (iVar10 == 0) {
                  iVar10 = 0;
                  goto LAB_001e3ac8;
                }
                iVar13 = 5;
              }
              else {
LAB_001e3ac8:
                iVar13 = 0;
                if (0 < pFVar4->nTerm) {
                  lVar15 = 0;
                  piVar22 = (int *)(local_178 + 0xc);
                  do {
                    iVar13 = sqlite3Fts5PoslistNext64
                                       (*(u8 **)(piVar22 + -3),piVar22[-1],piVar22,
                                        (i64 *)(piVar22 + 3));
                    if (iVar13 != 0) {
                      *(undefined1 *)((long)piVar22 + 5) = 1;
                    }
                    if (*(char *)((long)piVar22 + 5) != '\0') {
                      iVar13 = 5;
                      break;
                    }
                    lVar15 = lVar15 + 1;
                    piVar22 = piVar22 + 8;
                    iVar13 = 0;
                  } while (lVar15 < pFVar4->nTerm);
                }
              }
LAB_001e3b1c:
            } while (iVar13 == 0);
            if (iVar13 == 5) {
LAB_001e3b3f:
              iVar13 = (pFVar4->poslist).n;
              if (0 < pFVar4->nTerm) {
                pcVar25 = local_178 + 0x10;
                lVar15 = 0;
                do {
                  if (*pcVar25 != '\0') {
                    sqlite3_free(*(void **)(pcVar25 + -0x10));
                  }
                  lVar15 = lVar15 + 1;
                  pcVar25 = pcVar25 + 0x20;
                } while (lVar15 < pFVar4->nTerm);
              }
              if (local_178 != local_f8) {
                sqlite3_free(local_178);
              }
              local_12c = iVar10;
              if (0 < iVar13) goto LAB_001e3baa;
              break;
            }
          }
          else {
            iVar13 = sqlite3_initialize();
            if (iVar13 == 0) {
              local_178 = (undefined1 *)sqlite3Malloc((long)iVar10 << 5);
            }
            else {
              local_178 = (undefined1 *)0x0;
            }
            if (local_178 != (undefined1 *)0x0) goto LAB_001e384e;
          }
LAB_001e3be0:
          local_12c = 7;
          break;
        }
        pFVar5 = pFVar4->aTerm[0].pIter;
        nData = pFVar5->nData;
        puVar6 = pFVar5->pData;
        (pFVar4->poslist).n = 0;
        sqlite3Fts5BufferAppendBlob(&local_12c,&pFVar4->poslist,nData,puVar6);
LAB_001e3baa:
        lVar24 = lVar24 + 1;
      } while (local_12c == 0);
    }
    local_178._0_4_ = local_12c;
    uVar18 = 0;
    if (((int)lVar24 == pFVar3->nPhrase) && (uVar18 = 1, (int)lVar24 != 1)) {
      __s = (Fts5LookaheadReader *)local_f8;
      memset(__s,0xaa,0xc0);
      local_128.p = (u8 *)CONCAT44(local_128.p._4_4_,(int)local_178);
      if ((long)pFVar3->nPhrase < 5) {
        memset(__s,0,0xc0);
      }
      else {
        __s = (Fts5LookaheadReader *)
              sqlite3Fts5MallocZero((int *)&local_128,(long)pFVar3->nPhrase * 0x30);
      }
      if ((int)local_128.p == 0) {
        if (0 < pFVar3->nPhrase) {
          lVar24 = 0;
          pFVar28 = __s;
          do {
            pFVar4 = pFVar3->apPhrase[lVar24];
            puVar6 = (pFVar4->poslist).p;
            iVar10 = (pFVar4->poslist).n;
            pFVar28->a = (u8 *)0x0;
            pFVar28->n = 0;
            pFVar28->i = 0;
            pFVar28->iPos = 0;
            pFVar28->iLookahead = 0;
            pFVar28->a = puVar6;
            pFVar28->n = iVar10;
            fts5LookaheadReaderNext(pFVar28);
            fts5LookaheadReaderNext(pFVar28);
            (pFVar4->poslist).n = 0;
            *(Fts5Buffer **)&pFVar28[1].n = &pFVar4->poslist;
            lVar24 = lVar24 + 1;
            pFVar28 = (Fts5LookaheadReader *)&pFVar28[1].iPos;
          } while (lVar24 < pFVar3->nPhrase);
        }
        pFVar19 = pFVar3;
        do {
          lVar24 = __s->iPos;
          do {
            if (pFVar3->nPhrase < 1) {
              bVar17 = false;
            }
            else {
              bVar17 = true;
              pFVar19 = (Fts5ExprNearset *)0x0;
              do {
                lVar26 = lVar24 - ((long)pFVar3->nNear +
                                  (long)pFVar3->apPhrase[(long)pFVar19]->nTerm);
                lVar15 = *(long *)((long)__s + (long)pFVar19 * 0x30 + 0x10);
                bVar29 = true;
                if ((lVar24 < lVar15) || (iVar10 = 0, lVar15 < lVar26)) {
                  pFVar28 = (Fts5LookaheadReader *)((long)pFVar19 * 0x30 + (long)__s);
                  do {
                    lVar15 = pFVar28->iPos;
                    if (lVar26 <= lVar15) {
                      if (lVar24 < lVar15) {
                        lVar24 = lVar15;
                      }
                      iVar10 = 0;
                      goto LAB_001e3d6f;
                    }
                    iVar10 = fts5LookaheadReaderNext(pFVar28);
                  } while (iVar10 == 0);
                  bVar29 = false;
                  iVar10 = 0xe;
LAB_001e3d6f:
                  bVar17 = false;
                }
                if (!bVar29) goto LAB_001e3e2c;
                pFVar19 = (Fts5ExprNearset *)((long)&pFVar19->nNear + 1);
              } while ((long)pFVar19 < (long)pFVar3->nPhrase);
              bVar17 = !bVar17;
            }
          } while (bVar17);
          uVar18 = pFVar3->nPhrase;
          if (0 < (int)uVar18) {
            lVar24 = 0;
            pFVar28 = __s + 1;
            do {
              if (((*(Fts5Buffer **)&pFVar28->n)->n == 0) || ((u8 *)pFVar28[-1].iPos != pFVar28->a))
              {
                sqlite3Fts5PoslistWriterAppend
                          (*(Fts5Buffer **)&pFVar28->n,(Fts5PoslistWriter *)pFVar28,pFVar28[-1].iPos
                          );
              }
              lVar24 = lVar24 + 1;
              uVar18 = pFVar3->nPhrase;
              pFVar28 = (Fts5LookaheadReader *)&pFVar28[1].iPos;
            } while (lVar24 < (int)uVar18);
          }
          if ((int)uVar18 < 1) {
            lVar24 = 0;
          }
          else {
            lVar24 = __s->iLookahead;
            uVar16 = 0;
            uVar21 = 0;
            piVar20 = &__s->iLookahead;
            do {
              if (*piVar20 < lVar24) {
                uVar21 = uVar16 & 0xffffffff;
                lVar24 = *piVar20;
              }
              uVar16 = uVar16 + 1;
              piVar20 = piVar20 + 6;
            } while (uVar18 != uVar16);
            lVar24 = (long)(int)uVar21;
          }
          iVar10 = fts5LookaheadReaderNext((Fts5LookaheadReader *)(lVar24 * 0x30 + (long)__s));
          if (iVar10 != 0) {
            iVar10 = 0xe;
          }
LAB_001e3e2c:
          uVar18 = (uint)pFVar19;
        } while (iVar10 == 0);
        if (iVar10 == 0xe) {
          uVar18 = (uint)(0 < *(int *)(*(long *)&__s[1].n + 8));
          local_178._0_4_ = (int)local_128.p;
          if (__s != (Fts5LookaheadReader *)local_f8) {
            sqlite3_free(__s);
          }
        }
      }
      else {
        uVar18 = 0;
        local_178._0_4_ = (int)local_128.p;
      }
      uVar18 = uVar18 & 1;
    }
  }
  else {
    pFVar4 = pFVar3->apPhrase[0];
    (pFVar4->poslist).n = 0;
    pFVar11 = pFVar4->aTerm;
    do {
      pFVar5 = pFVar11->pIter;
      if (((pFVar5->bEof == '\0') && (pFVar5->iRowid == lVar24)) && (0 < pFVar5->nData)) {
        (pFVar4->poslist).n = 1;
      }
      pFVar11 = pFVar11->pSynonym;
    } while (pFVar11 != (Fts5ExprTerm *)0x0);
    uVar18 = (pFVar4->poslist).n;
    local_178._0_4_ = iVar10;
  }
  pNode->bNomatch = (uint)(uVar18 == 0 && (int)local_178 == 0);
LAB_001e3735:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)local_178;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5ExprNodeTest_STRING(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode
){
  Fts5ExprNearset *pNear = pNode->pNear;
  Fts5ExprPhrase *pLeft = pNear->apPhrase[0];
  int rc = SQLITE_OK;
  i64 iLast;                      /* Lastest rowid any iterator points to */
  int i, j;                       /* Phrase and token index, respectively */
  int bMatch;                     /* True if all terms are at the same rowid */
  const int bDesc = pExpr->bDesc;

  /* Check that this node should not be FTS5_TERM */
  assert( pNear->nPhrase>1
       || pNear->apPhrase[0]->nTerm>1
       || pNear->apPhrase[0]->aTerm[0].pSynonym
       || pNear->apPhrase[0]->aTerm[0].bFirst
  );

  /* Initialize iLast, the "lastest" rowid any iterator points to. If the
  ** iterator skips through rowids in the default ascending order, this means
  ** the maximum rowid. Or, if the iterator is "ORDER BY rowid DESC", then it
  ** means the minimum rowid.  */
  if( pLeft->aTerm[0].pSynonym ){
    iLast = fts5ExprSynonymRowid(&pLeft->aTerm[0], bDesc, 0);
  }else{
    iLast = pLeft->aTerm[0].pIter->iRowid;
  }

  do {
    bMatch = 1;
    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      for(j=0; j<pPhrase->nTerm; j++){
        Fts5ExprTerm *pTerm = &pPhrase->aTerm[j];
        if( pTerm->pSynonym ){
          i64 iRowid = fts5ExprSynonymRowid(pTerm, bDesc, 0);
          if( iRowid==iLast ) continue;
          bMatch = 0;
          if( fts5ExprSynonymAdvanceto(pTerm, bDesc, &iLast, &rc) ){
            pNode->bNomatch = 0;
            pNode->bEof = 1;
            return rc;
          }
        }else{
          Fts5IndexIter *pIter = pPhrase->aTerm[j].pIter;
          if( pIter->iRowid==iLast ) continue;
          bMatch = 0;
          if( fts5ExprAdvanceto(pIter, bDesc, &iLast, &rc, &pNode->bEof) ){
            return rc;
          }
        }
      }
    }
  }while( bMatch==0 );

  pNode->iRowid = iLast;
  pNode->bNomatch = ((0==fts5ExprNearTest(&rc, pExpr, pNode)) && rc==SQLITE_OK);
  assert( pNode->bEof==0 || pNode->bNomatch==0 );

  return rc;
}